

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

void __thiscall Arcflow::final_compression_step(Arcflow *this)

{
  allocator<int> *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  runtime_error *prVar4;
  size_type __n;
  reference this_01;
  reference ppVar5;
  const_reference pvVar6;
  reference this_02;
  reference pvVar7;
  int *piVar8;
  reference pvVar9;
  reference piVar10;
  int *v_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> order;
  undefined1 local_320 [4];
  int d;
  vector<int,_std::allocator<int>_> *local_308;
  vector<int,_std::allocator<int>_> *lv;
  int it;
  int v;
  char _error_msg__1 [256];
  pair<int,_int> *pa;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  undefined1 local_1c8 [8];
  vector<int,_std::allocator<int>_> lbl;
  undefined1 local_1a8 [4];
  int u;
  NodeSet NStmp;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  adj;
  undefined1 local_140 [8];
  vector<int,_std::allocator<int>_> labels;
  int nv;
  char local_118 [8];
  char _error_msg_ [256];
  Arcflow *this_local;
  
  if ((this->ready & 1U) != 0) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x17e);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,local_118);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = NodeSet::size(&this->NS);
  __n = (size_type)
        (int)labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  this_00 = (allocator<int> *)
            ((long)&adj.
                    super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,__n,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&adj.
                     super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  get_adj((adj_list *)
          &NStmp.labels.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage,
          (int)labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,&this->A,true);
  NodeSet::NodeSet((NodeSet *)local_1a8);
  lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  do {
    iVar3 = lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_;
    iVar2 = NodeSet::size(&this->NS);
    if (iVar2 <= iVar3) {
      NodeSet::operator=(&this->NS,(NodeSet *)local_1a8);
      NodeSet::topological_order((vector<int,_std::allocator<int>_> *)&__range1,&this->NS);
      __end1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_140);
      v_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)local_140);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&v_1), bVar1) {
        piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end1);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&__range1,(long)*piVar10);
        *piVar10 = *pvVar9;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end1);
      }
      relabel_graph(this,(vector<int,_std::allocator<int>_> *)local_140);
      NodeSet::sort(&this->NS);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range1);
      NodeSet::~NodeSet((NodeSet *)local_1a8);
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 *)&NStmp.labels.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_140);
      return;
    }
    iVar3 = this->label_size;
    __range2._4_4_ = 0;
    std::allocator<int>::allocator((allocator<int> *)((long)&__range2 + 3));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1c8,(long)iVar3,
               (value_type *)((long)&__range2 + 4),(allocator<int> *)((long)&__range2 + 3));
    std::allocator<int>::~allocator((allocator<int> *)((long)&__range2 + 3));
    this_01 = std::
              vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            *)&NStmp.labels.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_);
    __end2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(this_01)
    ;
    pa = (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                       *)&pa), bVar1) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&__end2);
      if (lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ <= ppVar5->first) {
        snprintf((char *)&it,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "pa.first < u",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x187);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,(char *)&it);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_140,(long)ppVar5->first);
      lv._4_4_ = *pvVar9;
      lv._0_4_ = ppVar5->second;
      NodeSet::get_label((vector<int,_std::allocator<int>_> *)local_320,(NodeSet *)local_1a8,
                         lv._4_4_);
      local_308 = (vector<int,_std::allocator<int>_> *)local_320;
      for (order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ = 0;
          order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < (this->inst).ndims;
          order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_ + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_1c8,
                            (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_308,
                            (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
        iVar3 = *pvVar6;
        this_02 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->weights,(long)(int)lv);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (this_02,(long)order.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = iVar3 + *pvVar7;
        piVar8 = std::max<int>(pvVar9,(int *)&order.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar3 = *piVar8;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_1c8,
                            (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
        *pvVar9 = iVar3;
      }
      if (((this->inst).binary & 1U) != 0) {
        if ((int)lv == this->LOSS) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_1c8,
                              (long)(this->inst).ndims);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (local_308,(long)(this->inst).ndims);
          piVar8 = std::max<int>(pvVar9,pvVar6);
          iVar3 = *piVar8;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_1c8,
                              (long)(this->inst).ndims);
          *pvVar9 = iVar3;
        }
        else {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_1c8,
                              (long)(this->inst).ndims);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (local_308,(long)(this->inst).ndims);
          piVar8 = std::max<int>(pvVar6,(int *)&lv);
          piVar8 = std::max<int>(pvVar9,piVar8);
          iVar3 = *piVar8;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_1c8,
                              (long)(this->inst).ndims);
          *pvVar9 = iVar3;
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_320);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&__end2);
    }
    iVar3 = NodeSet::get_index((NodeSet *)local_1a8,(vector<int,_std::allocator<int>_> *)local_1c8);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_140,
                        (long)lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
    *pvVar9 = iVar3;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1c8);
    lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         lbl.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  } while( true );
}

Assistant:

void Arcflow::final_compression_step() {
	throw_assert(ready == false);
	int nv = NS.size();
	std::vector<int> labels(nv);
	std::vector<std::vector<int_pair>> adj = get_adj(nv, A, TRANSPOSE);

	NodeSet NStmp;
	for (int u = 0; u < NS.size(); u++) {
		std::vector<int> lbl(label_size, 0);
		for (const auto &pa : adj[u]) {
			throw_assert(pa.first < u);
			int v = labels[pa.first];
			int it = pa.second;
			const std::vector<int> &lv = NStmp.get_label(v);
			for (int d = 0; d < inst.ndims; d++) {
				lbl[d] = std::max(lbl[d], lv[d] + weights[it][d]);
			}
			if (inst.binary) {
				if (it == LOSS) {
					lbl[inst.ndims] = std::max(lbl[inst.ndims],
											   lv[inst.ndims]);
				} else {
					lbl[inst.ndims] = std::max(lbl[inst.ndims],
											   std::max(lv[inst.ndims], it));
				}
			}
		}
		labels[u] = NStmp.get_index(lbl);
	}

	NS = NStmp;
	std::vector<int> order = NS.topological_order();
	for (int &v : labels) {
		v = order[v];
	}
	relabel_graph(labels);
	NS.sort();
}